

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidationContextImpl.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::ValidationContextImpl::ValidationContextImpl
          (ValidationContextImpl *this,MemoryManager *manager)

{
  RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher> *this_00;
  
  (this->super_ValidationContext).fMemoryManager = manager;
  (this->super_ValidationContext)._vptr_ValidationContext =
       (_func_int **)&PTR__ValidationContextImpl_00401ca8;
  this->fIdRefList = (RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher> *)0x0;
  this->fEntityDeclPool = (NameIdPool<xercesc_4_0::DTDEntityDecl> *)0x0;
  this->fToCheckIdRefList = true;
  this->fValidatingMemberType = (DatatypeValidator *)0x0;
  this->fElemStack = (ElemStack *)0x0;
  this->fScanner = (XMLScanner *)0x0;
  this->fNamespaceScope = (NamespaceScope *)0x0;
  this_00 = (RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher> *)
            XMemory::operator_new(0x38,manager);
  RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher>::RefHashTableOf
            (this_00,0x6d,(this->super_ValidationContext).fMemoryManager);
  this->fIdRefList = this_00;
  return;
}

Assistant:

ValidationContextImpl::ValidationContextImpl(MemoryManager* const manager)
:ValidationContext(manager)
,fIdRefList(0)
,fEntityDeclPool(0)
,fToCheckIdRefList(true)
,fValidatingMemberType(0)
,fElemStack(0)
,fScanner(0)
,fNamespaceScope(0)
{
    fIdRefList = new (fMemoryManager) RefHashTableOf<XMLRefInfo>(109, fMemoryManager);
}